

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathNodeSetDel(xmlNodeSetPtr cur,xmlNodePtr val)

{
  xmlNodePtr ns;
  uint uVar1;
  ulong uVar2;
  
  if (val != (xmlNodePtr)0x0 && cur != (xmlNodeSetPtr)0x0) {
    uVar1 = cur->nodeNr;
    if (0 < (int)uVar1) {
      uVar2 = 0;
      do {
        if (cur->nodeTab[uVar2] == val) {
          ns = cur->nodeTab[uVar2];
          if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
            xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
            uVar1 = cur->nodeNr;
          }
          uVar1 = uVar1 - 1;
          cur->nodeNr = uVar1;
          if ((int)uVar2 < (int)uVar1) {
            do {
              cur->nodeTab[uVar2] = cur->nodeTab[uVar2 + 1];
              uVar2 = uVar2 + 1;
            } while (uVar1 != uVar2);
          }
          cur->nodeTab[(int)uVar1] = (xmlNodePtr)0x0;
          return;
        }
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
  }
  return;
}

Assistant:

void
xmlXPathNodeSetDel(xmlNodeSetPtr cur, xmlNodePtr val) {
    int i;

    if (cur == NULL) return;
    if (val == NULL) return;

    /*
     * find node in nodeTab
     */
    for (i = 0;i < cur->nodeNr;i++)
        if (cur->nodeTab[i] == val) break;

    if (i >= cur->nodeNr) {	/* not found */
        return;
    }
    if ((cur->nodeTab[i] != NULL) &&
	(cur->nodeTab[i]->type == XML_NAMESPACE_DECL))
	xmlXPathNodeSetFreeNs((xmlNsPtr) cur->nodeTab[i]);
    cur->nodeNr--;
    for (;i < cur->nodeNr;i++)
        cur->nodeTab[i] = cur->nodeTab[i + 1];
    cur->nodeTab[cur->nodeNr] = NULL;
}